

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.h
# Opt level: O0

AttributeSpecSyntax * __thiscall
slang::syntax::SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>::operator[]
          (SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *this,size_t index)

{
  reference this_00;
  SyntaxNode *this_01;
  AttributeSpecSyntax *pAVar1;
  size_t index_local;
  SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *this_local;
  
  this_00 = nonstd::span_lite::span<slang::syntax::TokenOrSyntax,_18446744073709551615UL>::
            operator[](&this->elements,index << 1);
  this_01 = TokenOrSyntax::node(this_00);
  pAVar1 = SyntaxNode::as<slang::syntax::AttributeSpecSyntax>(this_01);
  return pAVar1;
}

Assistant:

T* operator[](size_t index) {
        index <<= 1;
        return &elements[index].node()->template as<T>();
    }